

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::PutDeferred
          (SscWriterGeneric *this,VariableBase *variable,void *data)

{
  pointer pvVar1;
  pointer pBVar2;
  void *__s2;
  size_t sVar3;
  size_t __n;
  size_type sVar4;
  unsigned_long uVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  unsigned_long *puVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  unsigned_long *puVar13;
  size_t sVar14;
  size_type *psVar15;
  pointer puVar16;
  ulong __n_00;
  pointer pBVar17;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (*(int *)(variable + 0x28) == 0xe) {
    iVar11 = (this->super_SscWriterBase).m_StreamRank;
    pvVar1 = (this->m_GlobalWritePattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar17 = pvVar1[iVar11].
              super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = *(pointer *)
              ((long)&pvVar1[iVar11].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pBVar17 != pBVar2) {
      bVar9 = false;
      do {
        __s2 = *(void **)(variable + 8);
        sVar3 = *(size_t *)(variable + 0x10);
        while ((__n = (pBVar17->name)._M_string_length, __n != sVar3 ||
               ((__n != 0 && (iVar11 = bcmp((pBVar17->name)._M_dataplus._M_p,__s2,__n), iVar11 != 0)
                )))) {
          pBVar17 = pBVar17 + 1;
          if (pBVar17 == pBVar2) {
            if (bVar9) {
              return;
            }
            goto LAB_0013e82e;
          }
        }
        __n_00 = *(ulong *)((long)data + 8);
        if (pBVar17->bufferCount < __n_00) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SSCWriter","");
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"PutDeferredCommon","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"SSC only accepts fixed length string variables","");
          helper::Throw<std::invalid_argument>(&local_f8,&local_b8,&local_d8,&local_98,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          __n_00 = *(size_t *)((long)data + 8);
        }
        memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar17->bufferStart,*data,__n_00);
        pBVar17 = pBVar17 + 1;
        bVar9 = true;
        if (pBVar17 == pBVar2) {
          return;
        }
      } while( true );
    }
LAB_0013e82e:
    if ((((this->super_SscWriterBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::emplace_back<>((this->m_GlobalWritePattern).
                       super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->super_SscWriterBase).m_StreamRank);
      pBVar17 = *(pointer *)
                 ((long)&(this->m_GlobalWritePattern).
                         super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(this->super_SscWriterBase).m_StreamRank].
                         super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                         ._M_impl.super__Vector_impl_data + 8);
      std::__cxx11::string::_M_assign((string *)(pBVar17 + -1));
      pBVar17[-1].type = String;
      pBVar17[-1].shapeId = *(ShapeID *)(variable + 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].shape,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].start,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].count,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
      sVar14 = (this->super_SscWriterBase).m_Buffer.m_Size;
      pBVar17[-1].bufferStart = sVar14;
      sVar6 = *(size_t *)((long)data + 8);
      pBVar17[-1].bufferCount = sVar6;
      Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar6 + sVar14);
      memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar17[-1].bufferStart,*data,
             *(size_t *)((long)data + 8));
      std::vector<char,_std::allocator<char>_>::resize
                (&pBVar17[-1].value,*(size_type *)((long)data + 8));
      memcpy(pBVar17[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,*data,*(size_t *)((long)data + 8));
      return;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SSCWriter","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"PutDeferredCommon","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"IO pattern changed after locking","");
    helper::Throw<std::invalid_argument>(&local_f8,&local_b8,&local_d8,&local_98,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return;
    }
    goto LAB_0013ecbe;
  }
  if (((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) &&
     ((this->super_SscWriterBase).m_WriterRank != 0)) {
    return;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
  if (*(int *)((this->super_SscWriterBase).m_IO + 0x58) != 0) {
    psVar15 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < psVar15 &&
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity + 1);
        sVar4 = paVar7->_M_allocated_capacity;
        paVar7->_M_allocated_capacity = *psVar15;
        *psVar15 = sVar4;
        psVar15 = psVar15 + -1;
        paVar7 = paVar12;
      } while (paVar12 < psVar15);
    }
    puVar16 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar8 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar16 &&
        local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar13 = puVar8 + 1;
        uVar5 = *puVar8;
        *puVar8 = *puVar16;
        *puVar16 = uVar5;
        puVar16 = puVar16 + -1;
        puVar8 = puVar13;
      } while (puVar13 < puVar16);
    }
    puVar16 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar8 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar16 &&
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar13 = puVar8 + 1;
        uVar5 = *puVar8;
        *puVar8 = *puVar16;
        *puVar16 = uVar5;
        puVar16 = puVar16 + -1;
        puVar8 = puVar13;
      } while (puVar13 < puVar16);
    }
  }
  iVar11 = (this->super_SscWriterBase).m_StreamRank;
  pvVar1 = (this->m_GlobalWritePattern).
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar17 = pvVar1[iVar11].
            super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = *(pointer *)
            ((long)&pvVar1[iVar11].
                    super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (pBVar17 == pBVar2) {
LAB_0013e94a:
    if ((((this->super_SscWriterBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::emplace_back<>((this->m_GlobalWritePattern).
                       super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->super_SscWriterBase).m_StreamRank);
      pBVar17 = *(pointer *)
                 ((long)&(this->m_GlobalWritePattern).
                         super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(this->super_SscWriterBase).m_StreamRank].
                         super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                         ._M_impl.super__Vector_impl_data + 8);
      std::__cxx11::string::_M_assign((string *)(pBVar17 + -1));
      pBVar17[-1].type = *(DataType *)(variable + 0x28);
      pBVar17[-1].shapeId = *(ShapeID *)(variable + 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].shape,&local_78);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].start,&local_48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar17[-1].count,&local_60);
      sVar14 = *(size_t *)(variable + 0x30);
      pBVar17[-1].elementSize = sVar14;
      pBVar17[-1].bufferStart = (this->super_SscWriterBase).m_Buffer.m_Size;
      sVar14 = TotalDataSize(&pBVar17[-1].count,sVar14,&pBVar17[-1].shapeId);
      pBVar17[-1].bufferCount = sVar14;
      Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar14 + pBVar17[-1].bufferStart);
      memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar17[-1].bufferStart,data,
             pBVar17[-1].bufferCount);
      if ((pBVar17[-1].shapeId == LocalValue) || (pBVar17[-1].shapeId == GlobalValue)) {
        std::vector<char,_std::allocator<char>_>::resize
                  (&pBVar17[-1].value,*(size_type *)(variable + 0x30));
        memcpy(pBVar17[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,data,pBVar17[-1].bufferCount);
      }
      if (*(int *)(variable + 0x28) == 0x10) {
        adios2::core::StructDefinition::StructName_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&pBVar17[-1].structDef,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0013ec88;
      }
    }
    else {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SSCWriter","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"PutDeferredCommon","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"IO pattern changed after locking","");
      helper::Throw<std::invalid_argument>(&local_f8,&local_b8,&local_d8,&local_98,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0013ec88:
        operator_delete(local_f8._M_dataplus._M_p);
      }
    }
  }
  else {
    bVar9 = false;
    do {
      while ((((sVar3 = (pBVar17->name)._M_string_length, sVar3 == *(size_t *)(variable + 0x10) &&
               ((sVar3 == 0 ||
                (iVar11 = bcmp((pBVar17->name)._M_dataplus._M_p,*(void **)(variable + 8),sVar3),
                iVar11 == 0)))) && (bVar10 = AreSameDims(&local_48,&pBVar17->start), bVar10)) &&
             ((bVar10 = AreSameDims(&local_60,&pBVar17->count), bVar10 &&
              (bVar10 = AreSameDims(&local_78,&pBVar17->shape), bVar10))))) {
        memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar17->bufferStart,data,
               pBVar17->bufferCount);
        pBVar17 = pBVar17 + 1;
        bVar9 = true;
        if (pBVar17 == pBVar2) goto LAB_0013ec8d;
      }
      pBVar17 = pBVar17 + 1;
    } while (pBVar17 != pBVar2);
    if (!bVar9) goto LAB_0013e94a;
  }
LAB_0013ec8d:
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return;
  }
LAB_0013ecbe:
  operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SscWriterGeneric::PutDeferred(VariableBase &variable, const void *data)
{
    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        bool found = false;
        for (const auto &b : m_GlobalWritePattern[m_StreamRank])
        {
            if (b.name == variable.m_Name)
            {
                if (b.bufferCount < dataString->size())
                {
                    helper::Throw<std::invalid_argument>(
                        "Engine", "SSCWriter", "PutDeferredCommon",
                        "SSC only accepts fixed length string variables");
                }
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                found = true;
            }
        }

        if (!found)
        {
            if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
                m_ReaderSelectionsLocked == false)
            {
                m_GlobalWritePattern[m_StreamRank].emplace_back();
                auto &b = m_GlobalWritePattern[m_StreamRank].back();
                b.name = variable.m_Name;
                b.type = DataType::String;
                b.shapeId = variable.m_ShapeID;
                b.shape = variable.m_Shape;
                b.start = variable.m_Start;
                b.count = variable.m_Count;
                b.bufferStart = m_Buffer.size();
                b.bufferCount = dataString->size();
                m_Buffer.resize(b.bufferStart + b.bufferCount);
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                b.value.resize(dataString->size());
                std::memcpy(b.value.data(), dataString->data(), dataString->size());
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                     "IO pattern changed after locking");
            }
        }
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_GlobalWritePattern[m_StreamRank])
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            m_GlobalWritePattern[m_StreamRank].emplace_back();
            auto &b = m_GlobalWritePattern[m_StreamRank].back();
            b.name = variable.m_Name;
            b.type = variable.m_Type;
            b.shapeId = variable.m_ShapeID;
            b.shape = vShape;
            b.start = vStart;
            b.count = vCount;
            b.elementSize = variable.m_ElementSize;
            b.bufferStart = m_Buffer.size();
            b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
            m_Buffer.resize(b.bufferStart + b.bufferCount);
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
            {
                b.value.resize(variable.m_ElementSize);
                std::memcpy(b.value.data(), data, b.bufferCount);
            }
            if (variable.m_Type == DataType::Struct)
            {
                b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                                  ->m_WriteStructDefinition->StructName();
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                 "IO pattern changed after locking");
        }
    }
}